

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256-ni.c
# Opt level: O0

_Bool sha256_ni_available(void)

{
  uint *puVar1;
  long lVar2;
  uint CPUInfo [4];
  undefined1 local_9;
  
  puVar1 = (uint *)cpuid_basic_info(0);
  if (*puVar1 < 7) {
    local_9 = false;
  }
  else {
    lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
    local_9 = (*(uint *)(lVar2 + 4) & 0x20000000) != 0;
  }
  return local_9;
}

Assistant:

static bool sha256_ni_available(void)
{
    unsigned int CPUInfo[4];
    GET_CPU_ID_0(CPUInfo);
    if (CPUInfo[0] < 7)
        return false;

    GET_CPU_ID_7(CPUInfo);
    return CPUInfo[1] & (1 << 29); /* Check SHA */
}